

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_entity.cxx
# Opt level: O0

void __thiscall
xray_re::cse_abstract::set_save_marker
          (cse_abstract *this,xr_packet *packet,esm_mode mode,bool check,char *name)

{
  uint16_t uVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t sVar3;
  ulong uVar4;
  undefined4 extraout_var_00;
  size_t local_78;
  sm_record local_50;
  ulong local_40;
  size_t diff_1;
  size_t diff;
  sm_record *sm;
  char *name_local;
  bool check_local;
  xr_packet *pxStack_18;
  esm_mode mode_local;
  xr_packet *packet_local;
  cse_abstract *this_local;
  
  if (0x7a < this->m_version) {
    sm = (sm_record *)name;
    name_local._3_1_ = check;
    name_local._4_4_ = mode;
    pxStack_18 = packet;
    packet_local = (xr_packet *)this;
    if (check) {
      diff = (size_t)std::
                     stack<xray_re::cse_abstract::sm_record,_std::deque<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>_>
                     ::top(&this->m_markers);
      iVar2 = strcmp((char *)sm,((reference)diff)->name);
      if (iVar2 != 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                      ,0x136,
                      "void xray_re::cse_abstract::set_save_marker(xr_packet &, esm_mode, bool, const char *)"
                     );
      }
      if (name_local._4_4_ == SM_SAVE) {
        iVar2 = (*pxStack_18->_vptr_xr_packet[0x16])();
        diff_1 = CONCAT44(extraout_var,iVar2) - *(long *)(diff + 8);
        (*pxStack_18->_vptr_xr_packet[8])(pxStack_18,diff_1 & 0xffff);
      }
      else {
        sVar3 = xr_packet::r_tell(pxStack_18);
        uVar4 = sVar3 - *(long *)(diff + 8);
        local_40 = uVar4;
        uVar1 = xr_packet::r_u16(pxStack_18);
        if (uVar4 != uVar1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_entity.cxx"
                        ,0x13d,
                        "void xray_re::cse_abstract::set_save_marker(xr_packet &, esm_mode, bool, const char *)"
                       );
        }
      }
      std::
      stack<xray_re::cse_abstract::sm_record,_std::deque<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>_>
      ::pop(&this->m_markers);
    }
    else {
      if (mode == SM_SAVE) {
        iVar2 = (*packet->_vptr_xr_packet[0x16])();
        local_78 = CONCAT44(extraout_var_00,iVar2);
      }
      else {
        local_78 = xr_packet::r_tell(packet);
      }
      sm_record::sm_record(&local_50,name,local_78);
      std::
      stack<xray_re::cse_abstract::sm_record,_std::deque<xray_re::cse_abstract::sm_record,_std::allocator<xray_re::cse_abstract::sm_record>_>_>
      ::push(&this->m_markers,&local_50);
    }
  }
  return;
}

Assistant:

void cse_abstract::set_save_marker(xr_packet& packet, esm_mode mode, bool check, const char* name)
{
	if (m_version < CSE_VERSION_0x7c_HACK)
		return;

	if (check) {
		const sm_record& sm = m_markers.top();
		if (std::strcmp(name, sm.name))
			xr_not_expected();
		if (mode == SM_SAVE) {
			size_t diff = packet.w_tell() - sm.offset;
			packet.w_u16(uint16_t(diff & UINT16_MAX));
		} else {
			size_t diff = packet.r_tell() - sm.offset;
			if (diff != packet.r_u16())
				xr_not_expected();
		}
		m_markers.pop();
	} else {
		m_markers.push(sm_record(name,
				mode == SM_SAVE ? packet.w_tell() : packet.r_tell()));
	}
}